

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_scale(Integer g_a,void *alpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  char *string;
  Integer *dims;
  Integer IVar8;
  logical lVar9;
  long lVar10;
  double *pdVar11;
  double *in_RSI;
  Integer in_RDI;
  SingleComplex val_3;
  DoubleComplex val_2;
  SingleComplex val_1;
  DoubleComplex val;
  Integer *in_stack_000000d8;
  Integer *in_stack_000000e0;
  Integer in_stack_000000e8;
  int _i;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  int local_sync_end;
  int local_sync_begin;
  void *ptr;
  Integer num_blocks;
  Integer i;
  Integer grp_id;
  Integer elems;
  Integer me;
  Integer type;
  Integer ndim;
  void *in_stack_00000258;
  Integer *in_stack_00000260;
  Integer *in_stack_00000268;
  Integer in_stack_00000270;
  long in_stack_fffffffffffffdd0;
  float local_220;
  float fStack_21c;
  Integer *in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  Integer in_stack_fffffffffffffe08;
  float fVar12;
  Integer in_stack_fffffffffffffe10;
  float fVar13;
  float local_1b8;
  float fStack_1b4;
  float local_188;
  float fStack_184;
  int local_14c;
  Integer local_148 [8];
  long local_108 [8];
  long local_c8 [6];
  Integer in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  long local_50;
  long local_40;
  long in_stack_ffffffffffffffd0;
  Integer *in_stack_ffffffffffffffe0;
  Integer *in_stack_ffffffffffffffe8;
  
  iVar7 = _ga_sync_end;
  iVar6 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  string = (char *)pnga_get_pgroup(in_RDI);
  if (iVar6 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffdd0);
  }
  dims = (Integer *)pnga_pgroup_nodeid((Integer)string);
  pnga_check_handle(in_stack_ffffffffffffffd0,string);
  IVar8 = pnga_total_blocks(in_RDI);
  pnga_inquire((Integer)in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,dims);
  if (IVar8 < 0) {
    pnga_distribution(_hi[0],in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    lVar9 = pnga_has_ghosts(in_RDI);
    if (lVar9 != 0) {
      pnga_scale_patch(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
      return;
    }
    if (0 < local_108[0]) {
      pnga_access_ptr(_dims[6],(Integer *)_dims[5],(Integer *)_dims[4],(void *)_dims[3],
                      (Integer *)_dims[2]);
      local_14c = 0;
      lVar10 = (local_108[(long)in_stack_ffffffffffffffe8 + -9] -
               local_108[(long)in_stack_ffffffffffffffe8 + -1]) + 1;
      for (; (long)local_14c < (long)in_stack_ffffffffffffffe8 + -1; local_14c = local_14c + 1) {
        if (local_c8[local_14c] != (local_108[(long)local_14c + -8] - local_108[local_14c]) + 1) {
          pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        }
        lVar10 = ((local_108[(long)local_14c + -8] - local_108[local_14c]) + 1) * lVar10;
      }
      switch(in_stack_ffffffffffffffe0) {
      case (Integer *)0x3e9:
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          *(int *)(local_50 + local_40 * 4) =
               (int)*(float *)in_RSI * *(int *)(local_50 + local_40 * 4);
        }
        break;
      case (Integer *)0x3ea:
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          *(long *)(local_50 + local_40 * 8) = (long)*in_RSI * *(long *)(local_50 + local_40 * 8);
        }
        break;
      case (Integer *)0x3eb:
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          *(float *)(local_50 + local_40 * 4) =
               *(float *)in_RSI * *(float *)(local_50 + local_40 * 4);
        }
        break;
      case (Integer *)0x3ec:
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          *(double *)(local_50 + local_40 * 8) = *in_RSI * *(double *)(local_50 + local_40 * 8);
        }
        break;
      default:
        pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        break;
      case (Integer *)0x3ee:
        dVar1 = *in_RSI;
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          uVar5 = *(undefined8 *)(local_50 + local_40 * 8);
          local_188 = SUB84(dVar1,0);
          local_1b8 = (float)uVar5;
          fStack_1b4 = (float)((ulong)uVar5 >> 0x20);
          fStack_184 = (float)((ulong)dVar1 >> 0x20);
          *(float *)(local_50 + local_40 * 8) = local_188 * local_1b8 + -(fStack_1b4 * fStack_184);
          *(float *)(local_50 + 4 + local_40 * 8) = fStack_184 * local_1b8 + fStack_1b4 * local_188;
        }
        break;
      case (Integer *)0x3ef:
        dVar1 = *in_RSI;
        dVar2 = in_RSI[1];
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          pdVar11 = (double *)(local_50 + local_40 * 0x10);
          dVar3 = *pdVar11;
          dVar4 = pdVar11[1];
          *(double *)(local_50 + local_40 * 0x10) = dVar1 * dVar3 + -(dVar4 * dVar2);
          *(double *)(local_50 + local_40 * 0x10 + 8) = dVar2 * dVar3 + dVar4 * dVar1;
        }
        break;
      case (Integer *)0x3f8:
        for (local_40 = 0; local_40 < lVar10; local_40 = local_40 + 1) {
          *(long *)(local_50 + local_40 * 8) = (long)*in_RSI * *(long *)(local_50 + local_40 * 8);
        }
      }
      pnga_release_update(in_RDI,local_108,local_148);
    }
  }
  else {
    pnga_access_block_segment_ptr
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdd0 = (long)in_stack_ffffffffffffffe0 + -0x3e9;
    switch(in_stack_fffffffffffffdd0) {
    case 0:
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        *(int *)(local_50 + local_40 * 4) =
             (int)*(float *)in_RSI * *(int *)(local_50 + local_40 * 4);
      }
      break;
    case 1:
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        *(long *)(local_50 + local_40 * 8) = (long)*in_RSI * *(long *)(local_50 + local_40 * 8);
      }
      break;
    case 2:
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        *(float *)(local_50 + local_40 * 4) = *(float *)in_RSI * *(float *)(local_50 + local_40 * 4)
        ;
      }
      break;
    case 3:
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        *(double *)(local_50 + local_40 * 8) = *in_RSI * *(double *)(local_50 + local_40 * 8);
      }
      break;
    default:
      pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      break;
    case 5:
      dVar1 = *in_RSI;
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        uVar5 = *(undefined8 *)(local_50 + local_40 * 8);
        fVar12 = SUB84(dVar1,0);
        local_220 = (float)uVar5;
        fStack_21c = (float)((ulong)uVar5 >> 0x20);
        fVar13 = (float)((ulong)dVar1 >> 0x20);
        *(float *)(local_50 + local_40 * 8) = fVar12 * local_220 + -(fStack_21c * fVar13);
        *(float *)(local_50 + 4 + local_40 * 8) = fVar13 * local_220 + fStack_21c * fVar12;
      }
      break;
    case 6:
      dVar1 = *in_RSI;
      dVar2 = in_RSI[1];
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        pdVar11 = (double *)(local_50 + local_40 * 0x10);
        dVar3 = *pdVar11;
        dVar4 = pdVar11[1];
        *(double *)(local_50 + local_40 * 0x10) = dVar1 * dVar3 + -(dVar4 * dVar2);
        *(double *)(local_50 + local_40 * 0x10 + 8) = dVar2 * dVar3 + dVar4 * dVar1;
      }
      break;
    case 0xf:
      for (local_40 = 0; local_40 < in_stack_ffffffffffffffd0; local_40 = local_40 + 1) {
        *(long *)(local_50 + local_40 * 8) = (long)*in_RSI * *(long *)(local_50 + local_40 * 8);
      }
    }
    pnga_release_update_block_segment(in_RDI,(Integer)dims);
  }
  if (iVar7 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffdd0);
  }
  return;
}

Assistant:

void pnga_scale(Integer g_a, void* alpha)
{
  Integer ndim, type, me, elems, grp_id;
  register Integer i;
  Integer num_blocks;
  void *ptr;
  int local_sync_begin,local_sync_end;
  Integer _dims[MAXDIM];
  Integer _ld[MAXDIM-1];
  Integer _lo[MAXDIM];
  Integer _hi[MAXDIM];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);

  me = pnga_pgroup_nodeid(grp_id);

  pnga_check_handle(g_a, "ga_scale");
  num_blocks = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, _dims);
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, _lo, _hi);
    if (pnga_has_ghosts(g_a)) {
      pnga_scale_patch(g_a, _lo, _hi, alpha);
      return;
    }

    if ( _lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      pnga_access_ptr(g_a, _lo, _hi, &ptr, _ld);
      GET_ELEMS(ndim,_lo,_hi,_ld,&elems);

      switch (type){
        int *ia;
        double *da;
        DoubleComplex *ca, scale;
        SingleComplex *cfa, cfscale;
        long *la;
        long long *lla;
        float *fa;
        case C_INT:
        ia = (int*)ptr;
        for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
        break;
        case C_LONG:
        la = (long*)ptr;
        for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
        break;
        case C_LONGLONG:
        lla = (long long*)ptr;
        for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
        break;
        case C_DCPL:
        ca = (DoubleComplex*)ptr;
        scale= *(DoubleComplex*)alpha;
        for(i=0;i<elems;i++){
          DoubleComplex val = ca[i]; 
          ca[i].real = scale.real*val.real  - val.imag * scale.imag;
          ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
        }
        break;
        case C_SCPL:
        cfa = (SingleComplex*)ptr;
        cfscale= *(SingleComplex*)alpha;
        for(i=0;i<elems;i++){
          SingleComplex val = cfa[i]; 
          cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
          cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
        }
        break;
        case C_DBL:
        da = (double*)ptr;
        for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
        break;
        case C_FLOAT:
        fa = (float*)ptr;
        for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
        break;       
        default: pnga_error(" wrong data type ",type);
      }

      /* release access to the data */
      pnga_release_update(g_a, _lo, _hi);
    }
  } else {
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    switch (type){
      int *ia;
      double *da;
      DoubleComplex *ca, scale;
      SingleComplex *cfa, cfscale;
      long *la;
      long long *lla;
      float *fa;
      case C_INT:
      ia = (int*)ptr;
      for(i=0;i<elems;i++) ia[i]  *= *(int*)alpha;
      break;
      case C_LONG:
      la = (long*)ptr;
      for(i=0;i<elems;i++) la[i]  *= *(long*)alpha;
      break;
      case C_LONGLONG:
      lla = (long long*)ptr;
      for(i=0;i<elems;i++) lla[i]  *= *(long long*)alpha;
      break;
      case C_DCPL:
      ca = (DoubleComplex*)ptr;
      scale= *(DoubleComplex*)alpha;
      for(i=0;i<elems;i++){
        DoubleComplex val = ca[i]; 
        ca[i].real = scale.real*val.real  - val.imag * scale.imag;
        ca[i].imag = scale.imag*val.real  + val.imag * scale.real;
      }
      break;
      case C_SCPL:
      cfa = (SingleComplex*)ptr;
      cfscale= *(SingleComplex*)alpha;
      for(i=0;i<elems;i++){
        SingleComplex val = cfa[i]; 
        cfa[i].real = cfscale.real*val.real  - val.imag * cfscale.imag;
        cfa[i].imag = cfscale.imag*val.real  + val.imag * cfscale.real;
      }
      break;
      case C_DBL:
      da = (double*)ptr;
      for(i=0;i<elems;i++) da[i] *= *(double*)alpha;
      break;
      case C_FLOAT:
      fa = (float*)ptr;
      for(i=0;i<elems;i++) fa[i]  *= *(float*)alpha;
      break;       
      default: pnga_error(" wrong data type ",type);
    }
    /* release access to the data */
    pnga_release_update_block_segment(g_a, me);
  }
  if(local_sync_end)pnga_pgroup_sync(grp_id); 
}